

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O2

pixel_format crnlib::pixel_format_helpers::convert_crn_format_to_pixel_format(crn_format fmt)

{
  pixel_format pVar1;
  
  pVar1 = PIXEL_FMT_INVALID;
  if ((ulong)fmt < 0xf) {
    pVar1 = *(pixel_format *)(&DAT_00188c58 + fmt * 4);
  }
  return pVar1;
}

Assistant:

pixel_format convert_crn_format_to_pixel_format(crn_format fmt)
        {
            switch (fmt)
            {
            case cCRNFmtDXT1:
                return PIXEL_FMT_DXT1;
            case cCRNFmtDXT3:
                return PIXEL_FMT_DXT3;
            case cCRNFmtDXT5:
                return PIXEL_FMT_DXT5;
            case cCRNFmtDXT5_CCxY:
                return PIXEL_FMT_DXT5_CCxY;
            case cCRNFmtDXT5_xGxR:
                return PIXEL_FMT_DXT5_xGxR;
            case cCRNFmtDXT5_xGBR:
                return PIXEL_FMT_DXT5_xGBR;
            case cCRNFmtDXT5_AGBR:
                return PIXEL_FMT_DXT5_AGBR;
            case cCRNFmtDXN_XY:
                return PIXEL_FMT_DXN;
            case cCRNFmtDXN_YX:
                return PIXEL_FMT_3DC;
            case cCRNFmtDXT5A:
                return PIXEL_FMT_DXT5A;
            case cCRNFmtETC1:
                return PIXEL_FMT_ETC1;
            case cCRNFmtETC2:
                return PIXEL_FMT_ETC2;
            case cCRNFmtETC2A:
                return PIXEL_FMT_ETC2A;
            case cCRNFmtETC1S:
                return PIXEL_FMT_ETC1S;
            case cCRNFmtETC2AS:
                return PIXEL_FMT_ETC2AS;
            default: {
                CRNLIB_ASSERT(false);
                break;
            }
            }

            return PIXEL_FMT_INVALID;
        }